

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::LoadBlockIndexDB(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *this_00;
  optional<node::BlockfileCursor> *poVar1;
  bool bVar2;
  pointer pCVar3;
  pointer pCVar4;
  BlockTreeDB *this_01;
  string_view source_file;
  _Alloc_hider _Var5;
  bool bVar6;
  Logger *pLVar7;
  _Base_ptr p_Var8;
  uint *puVar9;
  int iVar10;
  int *in_R8;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  _Self __tmp;
  int nFile;
  long lVar14;
  __node_base *p_Var15;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view str;
  string_view logging_function_02;
  Level level;
  char *fmt;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int max_blockfile_num;
  set<int,_std::less<int>,_std::allocator<int>_> setBlkDataFiles;
  FlatFilePos pos;
  bool fReindexing;
  char *pcStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = LoadBlockIndex(this,snapshot_blockhash);
  if (bVar6) {
    max_blockfile_num = 0;
    kernel::BlockTreeDB::ReadLastBlockFile
              ((this->m_block_tree_db)._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,&max_blockfile_num)
    ;
    this_00 = &this->m_blockfile_info;
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              (this_00,(long)max_blockfile_num + 1);
    pLVar7 = LogInstance();
    bVar6 = BCLog::Logger::Enabled(pLVar7);
    if (bVar6) {
      setBlkDataFiles._M_t._M_impl._0_8_ =
           &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffffffffff00);
      tinyformat::format<char[17],int>
                ((string *)&fReindexing,(tinyformat *)"%s: last block file = %i\n",
                 "LoadBlockIndexDB",(char (*) [17])&max_blockfile_num,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &setBlkDataFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fReindexing);
      std::__cxx11::string::~string((string *)&fReindexing);
      pLVar7 = LogInstance();
      _fReindexing = (pointer)0x5e;
      pcStack_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      in_stack_ffffffffffffff00 = 2;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x5e;
      str._M_str = (char *)setBlkDataFiles._M_t._M_impl._0_8_;
      str._M_len = setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      logging_function_02._M_str = "LoadBlockIndexDB";
      logging_function_02._M_len = 0x10;
      BCLog::Logger::LogPrintStr(pLVar7,str,logging_function_02,source_file,0x1fc,ALL,Info);
      std::__cxx11::string::~string((string *)&setBlkDataFiles);
    }
    lVar13 = 0;
    for (lVar14 = 0; lVar14 <= max_blockfile_num; lVar14 = lVar14 + 1) {
      kernel::BlockTreeDB::ReadBlockFileInfo
                ((this->m_block_tree_db)._M_t.
                 super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                 .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,(int)lVar14,
                 (CBlockFileInfo *)
                 ((long)&((this->m_blockfile_info).
                          super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start)->nBlocks + lVar13));
      lVar13 = lVar13 + 0x28;
    }
    CBlockFileInfo::ToString_abi_cxx11_
              ((string *)&setBlkDataFiles,
               (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>).
               _M_impl.super__Vector_impl_data._M_start + max_blockfile_num);
    fmt = "LoadBlockIndexDB";
    level = 0x6a1c41;
    logging_function._M_str = "LoadBlockIndexDB";
    logging_function._M_len = 0x10;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintf_<char[17],std::__cxx11::string>
              (logging_function,source_file_00,0x200,TOR,0x6a1c41,"LoadBlockIndexDB",
               (char (*) [17])&setBlkDataFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string((string *)&setBlkDataFiles);
    iVar10 = max_blockfile_num;
    while( true ) {
      iVar10 = iVar10 + 1;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffff00000000);
      setBlkDataFiles._M_t._M_impl._0_8_ = 0;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      bVar6 = kernel::BlockTreeDB::ReadBlockFileInfo
                        ((this->m_block_tree_db)._M_t.
                         super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                         .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,iVar10,
                         (value_type *)&setBlkDataFiles);
      if (!bVar6) break;
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::push_back
                (this_00,(value_type *)&setBlkDataFiles);
    }
    logging_function_00._M_str = "LoadBlockIndexDB";
    logging_function_00._M_len = 0x10;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x5e;
    ::LogPrintf_<>(logging_function_00,source_file_01,0x20b,
                   I2P|VALIDATION|QT|LIBEVENT|CMPCTBLOCK|REINDEX|SELECTCOINS|WALLETDB|BENCH|HTTP|
                   MEMPOOL|TOR|NET,level,fmt);
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var15 = &(this->m_block_index)._M_h._M_before_begin;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
      if (((ulong)p_Var15[0x10]._M_nxt & 8) != 0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &setBlkDataFiles,(int *)((long)&p_Var15[8]._M_nxt + 4));
      }
    }
    for (p_Var8 = setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar6 = (_Rb_tree_header *)p_Var8 == &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header,
        !bVar6; p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
      pos.nFile = p_Var8[1]._M_color;
      pos.nPos = 0;
      OpenBlockFile((AutoFile *)&fReindexing,this,&pos,true);
      _Var5._M_p = _fReindexing;
      AutoFile::~AutoFile((AutoFile *)&fReindexing);
      if (_Var5._M_p == (pointer)0x0) goto LAB_001de08a;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&fReindexing,
               &this->cs_LastBlockFile,"cs_LastBlockFile",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
               ,0x21b,false);
    pCVar3 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar4 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar2 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_engaged;
    iVar10 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_payload._M_value;
    puVar9 = &pCVar3->nHeightLast;
    for (uVar11 = 0; ((long)pCVar4 - (long)pCVar3) / 0x28 != uVar11; uVar11 = uVar11 + 1) {
      bVar12 = iVar10 <= (int)*puVar9 & bVar2;
      poVar1 = (this->m_blockfile_cursors)._M_elems + bVar12;
      if ((this->m_blockfile_cursors)._M_elems[bVar12].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
        (poVar1->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
      }
      (poVar1->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_payload =
           (_Storage<node::BlockfileCursor,_true>)(uVar11 & 0xffffffff);
      puVar9 = puVar9 + 10;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&fReindexing);
    this_01 = (this->m_block_tree_db)._M_t.
              super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>.
              _M_t.
              super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
              .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fReindexing,"prunedblockfiles",(allocator<char> *)&pos);
    kernel::BlockTreeDB::ReadFlag(this_01,(string *)&fReindexing,&this->m_have_pruned);
    std::__cxx11::string::~string((string *)&fReindexing);
    if (this->m_have_pruned == true) {
      logging_function_01._M_str = "LoadBlockIndexDB";
      logging_function_01._M_len = 0x10;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_02._M_len = 0x5e;
      ::LogPrintf_<>(logging_function_01,source_file_02,0x225,
                     I2P|VALIDATION|QT|LIBEVENT|CMPCTBLOCK|REINDEX|SELECTCOINS|RPC|BENCH|MEMPOOL|TOR
                     |NET,level,fmt);
    }
    _fReindexing = _fReindexing & 0xffffffffffffff00;
    kernel::BlockTreeDB::ReadReindexing
              ((this->m_block_tree_db)._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,&fReindexing);
    if (fReindexing == true) {
      LOCK();
      (this->m_blockfiles_indexed)._M_base._M_i = false;
      UNLOCK();
    }
LAB_001de08a:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&setBlkDataFiles._M_t);
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::LoadBlockIndexDB(const std::optional<uint256>& snapshot_blockhash)
{
    if (!LoadBlockIndex(snapshot_blockhash)) {
        return false;
    }
    int max_blockfile_num{0};

    // Load block file info
    m_block_tree_db->ReadLastBlockFile(max_blockfile_num);
    m_blockfile_info.resize(max_blockfile_num + 1);
    LogPrintf("%s: last block file = %i\n", __func__, max_blockfile_num);
    for (int nFile = 0; nFile <= max_blockfile_num; nFile++) {
        m_block_tree_db->ReadBlockFileInfo(nFile, m_blockfile_info[nFile]);
    }
    LogPrintf("%s: last block file info: %s\n", __func__, m_blockfile_info[max_blockfile_num].ToString());
    for (int nFile = max_blockfile_num + 1; true; nFile++) {
        CBlockFileInfo info;
        if (m_block_tree_db->ReadBlockFileInfo(nFile, info)) {
            m_blockfile_info.push_back(info);
        } else {
            break;
        }
    }

    // Check presence of blk files
    LogPrintf("Checking all blk files are present...\n");
    std::set<int> setBlkDataFiles;
    for (const auto& [_, block_index] : m_block_index) {
        if (block_index.nStatus & BLOCK_HAVE_DATA) {
            setBlkDataFiles.insert(block_index.nFile);
        }
    }
    for (std::set<int>::iterator it = setBlkDataFiles.begin(); it != setBlkDataFiles.end(); it++) {
        FlatFilePos pos(*it, 0);
        if (OpenBlockFile(pos, true).IsNull()) {
            return false;
        }
    }

    {
        // Initialize the blockfile cursors.
        LOCK(cs_LastBlockFile);
        for (size_t i = 0; i < m_blockfile_info.size(); ++i) {
            const auto last_height_in_file = m_blockfile_info[i].nHeightLast;
            m_blockfile_cursors[BlockfileTypeForHeight(last_height_in_file)] = {static_cast<int>(i), 0};
        }
    }

    // Check whether we have ever pruned block & undo files
    m_block_tree_db->ReadFlag("prunedblockfiles", m_have_pruned);
    if (m_have_pruned) {
        LogPrintf("LoadBlockIndexDB(): Block files have previously been pruned\n");
    }

    // Check whether we need to continue reindexing
    bool fReindexing = false;
    m_block_tree_db->ReadReindexing(fReindexing);
    if (fReindexing) m_blockfiles_indexed = false;

    return true;
}